

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

string * __thiscall
fmt::v7::detail::vformat_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,string_view format_str,format_args args)

{
  size_t sVar1;
  handle h;
  undefined1 value [16];
  undefined1 value_00 [16];
  type tVar2;
  string *result;
  char *__src;
  ptrdiff_t _Num;
  ulong __n;
  basic_string_view<char> format_str_00;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  args_00;
  undefined4 in_stack_fffffffffffffd8c;
  undefined2 in_stack_fffffffffffffd90;
  undefined6 in_stack_fffffffffffffd92;
  stringifier local_259;
  basic_string_view<char> local_258;
  long lStack_248;
  undefined8 local_240;
  undefined1 local_238 [544];
  
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_2
        )args.
         super_basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
         .desc_;
  args_00.desc_ = format_str.size_;
  format_str_00.size_ = format_str.data_;
  if ((format_str_00.size_ == (char *)0x2) && (*(short *)this == 0x7d7b)) {
    local_258.data_._0_4_ = 0;
    if ((long)args_00.desc_ < 0) {
      if ((int)(type)format_str.size_ < 1) {
        tVar2 = none_type;
      }
      else {
        sVar1 = ((args_00.field_1.values_)->field_0).string.size;
        local_258.data_._0_4_ = (uint)((args_00.field_1.values_)->field_0).ulong_long_value;
        in_stack_fffffffffffffd8c =
             (undefined4)(((args_00.field_1.values_)->field_0).ulong_long_value >> 0x20);
        in_stack_fffffffffffffd90 = (undefined2)sVar1;
        in_stack_fffffffffffffd92 = (undefined6)(sVar1 >> 0x10);
        tVar2 = (args_00.field_1.args_)->type_;
      }
    }
    else {
      tVar2 = (type)format_str.size_ & custom_type;
      if (((undefined1  [16])format_str & (undefined1  [16])0xf) != (undefined1  [16])0x0) {
        sVar1 = ((args_00.field_1.values_)->field_0).string.size;
        local_258.data_._0_4_ = (uint)((args_00.field_1.values_)->field_0).ulong_long_value;
        in_stack_fffffffffffffd8c =
             (undefined4)(((args_00.field_1.values_)->field_0).ulong_long_value >> 0x20);
        in_stack_fffffffffffffd90 = (undefined2)sVar1;
        in_stack_fffffffffffffd92 = (undefined6)(sVar1 >> 0x10);
      }
    }
    if (tVar2 == none_type) {
      error_handler::on_error((error_handler *)__return_storage_ptr__,"argument not found");
    }
    local_258.data_._4_4_ = in_stack_fffffffffffffd8c;
    local_258.size_._0_2_ = in_stack_fffffffffffffd90;
    switch(tVar2) {
    case int_type:
      to_string<int,_0>(__return_storage_ptr__,(uint)local_258.data_);
      break;
    case uint_type:
      to_string<unsigned_int,_0>(__return_storage_ptr__,(uint)local_258.data_);
      break;
    case long_long_type:
      to_string<long_long,_0>
                (__return_storage_ptr__,CONCAT44(in_stack_fffffffffffffd8c,(uint)local_258.data_));
      break;
    case ulong_long_type:
      to_string<unsigned_long_long,_0>
                (__return_storage_ptr__,CONCAT44(in_stack_fffffffffffffd8c,(uint)local_258.data_));
      break;
    case int128_type:
      value._4_4_ = in_stack_fffffffffffffd8c;
      value._0_4_ = (uint)local_258.data_;
      value._8_2_ = in_stack_fffffffffffffd90;
      value._10_6_ = in_stack_fffffffffffffd92;
      to_string<__int128,_0>(__return_storage_ptr__,(__int128)value);
      break;
    case uint128_type:
      value_00._4_4_ = in_stack_fffffffffffffd8c;
      value_00._0_4_ = (uint)local_258.data_;
      value_00._8_2_ = in_stack_fffffffffffffd90;
      value_00._10_6_ = in_stack_fffffffffffffd92;
      to_string<unsigned___int128,_0>(__return_storage_ptr__,(unsigned___int128)value_00);
      break;
    case bool_type:
      __n = (ulong)((uint)local_258.data_ & 1) ^ 5;
      __src = "false";
      if (((uint)local_258.data_ & 1) != 0) {
        __src = "true";
      }
      memcpy(&local_258,__src,__n);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,&local_258,(long)&local_258.data_ + __n);
      break;
    case char_type:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = (char)(uint)local_258.data_;
      __return_storage_ptr__->_M_string_length = 1;
      (__return_storage_ptr__->field_2)._M_local_buf[1] = '\0';
      break;
    case float_type:
      to_string<float,_0>(__return_storage_ptr__,(float *)&local_258);
      break;
    case double_type:
      to_string<double,_0>(__return_storage_ptr__,(double *)&local_258);
      break;
    case last_numeric_type:
      to_string<long_double,_0>(__return_storage_ptr__,(longdouble *)&local_258);
      break;
    case cstring_type:
      to_string<const_char_*,_0>(__return_storage_ptr__,&local_258.data_);
      break;
    case string_type:
      local_258.size_._2_6_ = in_stack_fffffffffffffd92;
      to_string<fmt::v7::basic_string_view<char>,_0>(__return_storage_ptr__,&local_258);
      break;
    case pointer_type:
      to_string<const_void_*,_0>(__return_storage_ptr__,&local_258.data_);
      break;
    case custom_type:
      h.custom_.value._4_4_ = in_stack_fffffffffffffd8c;
      h.custom_.value._0_4_ = (uint)local_258.data_;
      h.custom_.format._0_2_ = in_stack_fffffffffffffd90;
      h.custom_.format._2_6_ = in_stack_fffffffffffffd92;
      stringifier::operator()[abi_cxx11_(__return_storage_ptr__,&local_259,h);
      break;
    default:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/format.h"
                  ,0x6bf,"");
    }
  }
  else {
    lStack_248 = 0;
    local_258.data_._0_4_ = 0x137bd8;
    local_258.data_._4_4_ = 0;
    local_258.size_._0_2_ = SUB82(local_238,0);
    local_258.size_._2_6_ = (undefined6)((ulong)local_238 >> 0x10);
    local_240 = 500;
    format_str_00.data_ = (char *)this;
    vformat_to<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>
              ((buffer<char> *)&local_258,format_str_00,args_00,(locale_ref)0x0);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,
               CONCAT62(local_258.size_._2_6_,(undefined2)local_258.size_),
               lStack_248 + CONCAT62(local_258.size_._2_6_,(undefined2)local_258.size_));
    local_258.data_._0_4_ = 0x137bd8;
    local_258.data_._4_4_ = 0;
    if ((undefined1 *)CONCAT62(local_258.size_._2_6_,(undefined2)local_258.size_) != local_238) {
      operator_delete((undefined1 *)CONCAT62(local_258.size_._2_6_,(undefined2)local_258.size_));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FMT_FUNC std::string detail::vformat(string_view format_str, format_args args) {
  if (format_str.size() == 2 && equal2(format_str.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    return visit_format_arg(stringifier(), arg);
  }
  memory_buffer buffer;
  detail::vformat_to(buffer, format_str, args);
  return to_string(buffer);
}